

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

_Bool oonf_layer2_data_compare
                (oonf_layer2_value *left,oonf_layer2_value *right,
                oonf_layer2_data_comparator_type comparator,oonf_layer2_data_type data_type)

{
  int local_2c;
  int result;
  oonf_layer2_data_type data_type_local;
  oonf_layer2_data_comparator_type comparator_local;
  oonf_layer2_value *right_local;
  oonf_layer2_value *left_local;
  
  if (data_type == OONF_LAYER2_INTEGER_DATA) {
    if (right->integer < left->integer) {
      local_2c = 1;
    }
    else if (left->integer < right->integer) {
      local_2c = -1;
    }
    else {
      local_2c = 0;
    }
  }
  else if (data_type == OONF_LAYER2_BOOLEAN_DATA) {
    local_2c = memcmp(left,right,1);
  }
  else {
    if (data_type != OONF_LAYER2_NETWORK_DATA) {
      return false;
    }
    local_2c = memcmp(left,right,0x12);
  }
  switch(comparator) {
  case OONF_LAYER2_DATA_CMP_EQUALS:
    left_local._7_1_ = local_2c == 0;
    break;
  case OONF_LAYER2_DATA_CMP_NOT_EQUALS:
    left_local._7_1_ = local_2c != 0;
    break;
  case OONF_LAYER2_DATA_CMP_LESSER:
    left_local._7_1_ = local_2c < 0;
    break;
  case OONF_LAYER2_DATA_CMP_LESSER_OR_EQUALS:
    left_local._7_1_ = local_2c < 1;
    break;
  case OONF_LAYER2_DATA_CMP_GREATER:
    left_local._7_1_ = 0 < local_2c;
    break;
  case OONF_LAYER2_DATA_CMP_GREATER_OR_EQUALS:
    left_local._7_1_ = -1 < local_2c;
    break;
  default:
    left_local._7_1_ = false;
  }
  return left_local._7_1_;
}

Assistant:

bool
oonf_layer2_data_compare(const union oonf_layer2_value *left, const union oonf_layer2_value *right,
  enum oonf_layer2_data_comparator_type comparator, enum oonf_layer2_data_type data_type) {
  int result;

  switch (data_type) {
    case OONF_LAYER2_INTEGER_DATA:
      if (left->integer > right->integer) {
        result = 1;
      }
      else if (left->integer < right->integer) {
        result = -1;
      }
      else {
        result = 0;
      }
      break;
    case OONF_LAYER2_BOOLEAN_DATA:
      result = memcmp(&left->boolean, &right->boolean, sizeof(left->boolean));
      break;
    case OONF_LAYER2_NETWORK_DATA:
      result = memcmp(&left->addr, &right->addr, sizeof(left->addr));
      break;
    default:
      return false;
  }

  switch (comparator) {
    case OONF_LAYER2_DATA_CMP_EQUALS:
      return result == 0;
    case OONF_LAYER2_DATA_CMP_NOT_EQUALS:
      return result != 0;
    case OONF_LAYER2_DATA_CMP_LESSER:
      return result < 0;
    case OONF_LAYER2_DATA_CMP_LESSER_OR_EQUALS:
      return result <= 0;
    case OONF_LAYER2_DATA_CMP_GREATER:
      return result > 0;
    case OONF_LAYER2_DATA_CMP_GREATER_OR_EQUALS:
      return result >= 0;
    default:
      return false;
  }
}